

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpChunkedEntityWriter>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::HttpChunkedEntityWriter> *this,void *pointer)

{
  HttpOutputStream *this_00;
  char (*in_RDX) [6];
  Array<char> AStack_28;
  
  if (pointer != (void *)0x0) {
    this_00 = *(HttpOutputStream **)((long)pointer + 8);
    if ((this_00->writeInProgress == false) && ((this_00->inBody & 1U) != 0)) {
      str<char_const(&)[6]>((String *)&AStack_28,(kj *)0x355852,in_RDX);
      anon_unknown_31::HttpOutputStream::writeBodyData(this_00,(String *)&AStack_28);
      Array<char>::~Array(&AStack_28);
      anon_unknown_31::HttpOutputStream::finishBody(*(HttpOutputStream **)((long)pointer + 8));
    }
    else {
      anon_unknown_31::HttpOutputStream::abortBody(this_00);
    }
  }
  operator_delete(pointer,0x10);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }